

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::initActiveControl(PeleLM *this)

{
  int iVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ostream *os_;
  long in_RDI;
  int k;
  int fuelidx;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  specNames;
  Real s_ext [16];
  Box dumbx;
  GeometryData geomdata;
  Real time_l;
  int ctrl_flameDir_l;
  Real x [3];
  Real *s_ext_d;
  DeviceVector<amrex::Real> s_ext_v;
  DataContainer *lpmfdata;
  ACParm *lacparm;
  ProbParm *lprobparm;
  int dim;
  Real *probhi;
  Real *problo;
  Real area_tot;
  ParmParse ppAC;
  IntVect *in_stack_fffffffffffff748;
  Print *in_stack_fffffffffffff750;
  string *in_stack_fffffffffffff758;
  Geometry *in_stack_fffffffffffff760;
  value_type_conflict1 *in_stack_fffffffffffff770;
  ostream *in_stack_fffffffffffff778;
  Print *in_stack_fffffffffffff780;
  anon_class_192_8_f5a1a7c7 *in_stack_fffffffffffff798;
  Box *in_stack_fffffffffffff7a0;
  Print *in_stack_fffffffffffff7c0;
  Print *this_00;
  undefined8 in_stack_fffffffffffff7c8;
  long lVar4;
  string *in_stack_fffffffffffff7d0;
  allocator *name;
  ParmParse *in_stack_fffffffffffff7e0;
  int local_4f8;
  int local_4f4;
  double local_4d8 [16];
  undefined1 local_458 [32];
  int local_438;
  undefined8 local_430;
  undefined1 auStack_428 [120];
  ProbParm *local_3b0;
  ACParm *local_3a8;
  DataContainer *local_3a0;
  IntVect local_394;
  IntVect local_388 [3];
  undefined1 local_360 [120];
  undefined8 local_2e8;
  int local_2dc;
  Real local_2d8 [4];
  double *local_2b8;
  PODVector<double,_std::allocator<double>_> local_2b0;
  DataContainer *local_298;
  ACParm *local_290;
  ProbParm *local_288;
  int local_27c;
  Real *local_278;
  Real *local_270;
  double local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined4 local_248;
  allocator local_241;
  string local_240 [136];
  ParmParse local_1b8 [4];
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
  if (*(int *)(in_RDI + 8) == 0) {
    if (1 < NavierStokesBase::verbose) {
      amrex::OutStream();
      in_stack_fffffffffffff7e0 = local_1b8;
      amrex::Print::Print(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
      amrex::Print::operator<<(in_stack_fffffffffffff750,(char (*) [29])in_stack_fffffffffffff748);
      amrex::Print::~Print(in_stack_fffffffffffff7c0);
    }
    name = &local_241;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"active_control",name);
    amrex::ParmParse::ParmParse((ParmParse *)in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    amrex::ParmParse::query
              (in_stack_fffffffffffff7e0,(char *)name,(bool *)in_stack_fffffffffffff7d0,iVar1);
    amrex::ParmParse::query
              (in_stack_fffffffffffff7e0,(char *)name,(bool *)in_stack_fffffffffffff7d0,iVar1);
    amrex::ParmParse::query
              (in_stack_fffffffffffff7e0,(char *)name,(double *)in_stack_fffffffffffff7d0,iVar1);
    amrex::ParmParse::query
              (in_stack_fffffffffffff7e0,(char *)name,(double *)in_stack_fffffffffffff7d0,iVar1);
    amrex::ParmParse::query
              (in_stack_fffffffffffff7e0,(char *)name,(int *)in_stack_fffffffffffff7d0,iVar1);
    amrex::ParmParse::query
              (in_stack_fffffffffffff7e0,(char *)name,(double *)in_stack_fffffffffffff7d0,iVar1);
    amrex::ParmParse::query
              (in_stack_fffffffffffff7e0,(char *)name,(double *)in_stack_fffffffffffff7d0,iVar1);
    amrex::ParmParse::query
              (in_stack_fffffffffffff7e0,(char *)name,(double *)in_stack_fffffffffffff7d0,iVar1);
    amrex::ParmParse::query
              (in_stack_fffffffffffff7e0,(char *)name,(int *)in_stack_fffffffffffff7d0,iVar1);
    amrex::ParmParse::query
              (in_stack_fffffffffffff7e0,(char *)name,(int *)in_stack_fffffffffffff7d0,iVar1);
    amrex::ParmParse::query(in_stack_fffffffffffff7e0,(char *)name,in_stack_fffffffffffff7d0,iVar1);
    amrex::ParmParse::query
              (in_stack_fffffffffffff7e0,(char *)name,(int *)in_stack_fffffffffffff7d0,iVar1);
    amrex::ParmParse::query
              (in_stack_fffffffffffff7e0,(char *)name,(int *)in_stack_fffffffffffff7d0,iVar1);
    if (((ctrl_use_temp & 1U) != 0) && (ctrl_temperature <= 0.0)) {
      local_8 = "active_control.temperature MUST be set with active_control.use_temp = 1";
      amrex::Error_host((char *)in_stack_fffffffffffff760);
    }
    if (((ctrl_active & 1U) != 0) && (ctrl_tauControl <= 0.0)) {
      local_10 = "active_control.tau MUST be set when using active_control";
      amrex::Error_host((char *)in_stack_fffffffffffff760);
    }
    if (((ctrl_active & 1U) != 0) && (ctrl_h <= 0.0)) {
      local_18 = "active_control.height MUST be set when using active_control";
      amrex::Error_host((char *)in_stack_fffffffffffff760);
    }
    if (((ctrl_active & 1U) != 0) && (2 < ctrl_flameDir)) {
      local_20 = "active_control.flame_direction MUST be 0, 1 or 2 for X, Y and Z resp.";
      amrex::Error_host((char *)in_stack_fffffffffffff760);
    }
    if ((ctrl_active & 1U) == 0) {
      ac_parm->ctrl_active = (uint)(ctrl_active & 1);
      amrex::Gpu::copy<ACParm*,ACParm*>(ac_parm,ac_parm + 1,ac_parm_d);
      local_248 = 1;
    }
    else {
      ac_parm->ctrl_active = ctrl_active & 1;
      local_250 = 0xbff0000000000000;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff780,
                 (size_type)in_stack_fffffffffffff778,in_stack_fffffffffffff770);
      local_258 = 0xbff0000000000000;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff780,
                 (size_type)in_stack_fffffffffffff778,in_stack_fffffffffffff770);
      local_260 = 0xbff0000000000000;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff780,
                 (size_type)in_stack_fffffffffffff778,in_stack_fffffffffffff770);
      local_268 = 1.0;
      local_270 = amrex::Geometry::ProbLo((Geometry *)0x28fc56);
      local_278 = amrex::Geometry::ProbHi((Geometry *)0x28fc6f);
      for (local_27c = 0; local_27c < 3; local_27c = local_27c + 1) {
        if (local_27c != ctrl_flameDir) {
          local_268 = (local_278[local_27c] - local_270[local_27c]) * local_268;
        }
      }
      local_288 = prob_parm_d;
      local_290 = ac_parm_d;
      local_298 = pele::physics::PMF::PmfData::getDeviceData(&pmf_data);
      amrex::PODVector<double,_std::allocator<double>_>::PODVector
                ((PODVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff750,
                 (size_type)in_stack_fffffffffffff748);
      local_2b8 = amrex::PODVector<double,_std::allocator<double>_>::data(&local_2b0);
      local_2d8[0] = *local_270;
      local_2d8[1] = local_270[1];
      local_2d8[2] = local_270[2];
      local_2d8[ctrl_flameDir] = local_2d8[ctrl_flameDir] - 1.0;
      local_2dc = ctrl_flameDir;
      local_2e8 = 0xbff0000000000000;
      amrex::Geometry::data(in_stack_fffffffffffff760);
      amrex::IntVect::IntVect(local_388,0,0,0);
      amrex::IntVect::IntVect(&local_394,0,0,0);
      amrex::Box::Box((Box *)in_stack_fffffffffffff750,in_stack_fffffffffffff748,(IntVect *)0x28fe37
                     );
      this_00 = (Print *)local_458;
      lVar4 = 0;
      do {
        *(Real *)(&this_00->rank + lVar4 * 2) = local_2d8[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_458._24_8_ = local_2b8;
      local_438 = local_2dc;
      local_430 = 0xbff0000000000000;
      memcpy(auStack_428,local_360,0x78);
      local_3b0 = local_288;
      local_3a8 = local_290;
      local_3a0 = local_298;
      amrex::ParallelFor<PeleLM::initActiveControl()::__0>
                (in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
      memcpy(local_4d8,local_2b8,0x25);
      if ((ctrl_use_temp & 1U) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          local_28 = "Using activeControl based on fuel mass requires ns.fuelName !";
          amrex::Abort_host((char *)in_stack_fffffffffffff760);
        }
        amrex::
        Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x28ff93);
        pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
                  ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x28ff9d);
        local_4f4 = -1;
        for (local_4f8 = 0; local_4f8 < 9; local_4f8 = local_4f8 + 1) {
          pbVar3 = amrex::
                   Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff750,(size_type)in_stack_fffffffffffff748);
          iVar1 = std::__cxx11::string::compare((string *)pbVar3);
          if (iVar1 == 0) {
            local_4f4 = local_4f8;
          }
        }
        ctrl_scale = local_268 * local_4d8[first_spec + local_4f4];
        ctrl_cfix = ctrl_h * ctrl_scale;
        amrex::
        Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x290092);
      }
      else {
        ctrl_scale = 1.0;
        ctrl_cfix = ctrl_h;
      }
      ctrl_V_in = local_4d8[ctrl_flameDir];
      ctrl_V_in_old = ctrl_V_in;
      ac_parm->ctrl_V_in = ctrl_V_in;
      amrex::Gpu::copy<ACParm*,ACParm*>(ac_parm,ac_parm + 1,ac_parm_d);
      if ((ctrl_verbose != 0) && ((ctrl_active & 1U) != 0)) {
        if ((ctrl_use_temp & 1U) == 0) {
          os_ = amrex::OutStream();
          amrex::Print::Print(in_stack_fffffffffffff780,os_);
          amrex::Print::operator<<
                    (in_stack_fffffffffffff750,(char (*) [46])in_stack_fffffffffffff748);
          amrex::Print::operator<<
                    (in_stack_fffffffffffff750,(char (*) [27])in_stack_fffffffffffff748);
          amrex::Print::operator<<(in_stack_fffffffffffff750,(double *)in_stack_fffffffffffff748);
          amrex::Print::operator<<
                    (in_stack_fffffffffffff750,(char (*) [5])in_stack_fffffffffffff748);
          in_stack_fffffffffffff750 =
               amrex::Print::operator<<(in_stack_fffffffffffff750,in_stack_fffffffffffff748->vect);
          amrex::Print::operator<<
                    (in_stack_fffffffffffff750,(char (*) [14])in_stack_fffffffffffff748);
          amrex::Print::~Print(this_00);
        }
        else {
          amrex::OutStream();
          amrex::Print::Print(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
          amrex::Print::operator<<
                    (in_stack_fffffffffffff750,(char (*) [58])in_stack_fffffffffffff748);
          amrex::Print::operator<<
                    (in_stack_fffffffffffff750,(char (*) [27])in_stack_fffffffffffff748);
          amrex::Print::operator<<(in_stack_fffffffffffff750,(double *)in_stack_fffffffffffff748);
          amrex::Print::operator<<
                    (in_stack_fffffffffffff750,(char (*) [5])in_stack_fffffffffffff748);
          amrex::Print::operator<<(in_stack_fffffffffffff750,in_stack_fffffffffffff748->vect);
          amrex::Print::operator<<
                    (in_stack_fffffffffffff750,(char (*) [14])in_stack_fffffffffffff748);
          amrex::Print::~Print(this_00);
        }
      }
      amrex::PODVector<double,_std::allocator<double>_>::~PODVector
                ((PODVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff750);
      local_248 = 0;
    }
    amrex::ParmParse::~ParmParse((ParmParse *)0x290322);
  }
  return;
}

Assistant:

void
PeleLM::initActiveControl()
{
   if (level!=0) return;

   if (verbose > 1) Print() <<  "PeleLM::initActiveControl()\n";

   // Parse input file
   ParmParse ppAC("active_control");
   ppAC.query("on",ctrl_active);
   ppAC.query("use_temp",ctrl_use_temp);
   ppAC.query("temperature",ctrl_temperature);
   ppAC.query("tau",ctrl_tauControl);
   ppAC.query("v",ctrl_verbose);
   ppAC.query("height",ctrl_h);
   ppAC.query("changeMax",ctrl_changeMax);
   ppAC.query("velMax",ctrl_velMax);
   ppAC.query("pseudo_gravity",ctrl_pseudoGravity);
   ppAC.query("flame_direction",ctrl_flameDir);
   ppAC.query("AC_history",ctrl_AChistory);
   ppAC.query("npoints_average",ctrl_NavgPts);
   ppAC.query("method",ctrl_method);

   // Active control checks
   if ( ctrl_use_temp && (ctrl_temperature <= 0.0) )
      amrex::Error("active_control.temperature MUST be set with active_control.use_temp = 1");

   if ( ctrl_active && (ctrl_tauControl <= 0.0) )
      amrex::Error("active_control.tau MUST be set when using active_control");

   if ( ctrl_active && (ctrl_h <= 0.0) )
      amrex::Error("active_control.height MUST be set when using active_control");

   if ( ctrl_active && ( ctrl_flameDir > 2 ) )
      amrex::Error("active_control.flame_direction MUST be 0, 1 or 2 for X, Y and Z resp.");

   // Exit here if AC not activated
   if ( !ctrl_active ) {
      ac_parm->ctrl_active = ctrl_active;
      amrex::Gpu::copy(amrex::Gpu::hostToDevice,ac_parm,ac_parm+1,ac_parm_d);
      return;
   }

   // Activate AC in problem specific / GPU compliant sections
   ac_parm->ctrl_active = ctrl_active;

   // Resize vector for temporal average
   ctrl_time_pts.resize(ctrl_NavgPts+1,-1.0);
   ctrl_velo_pts.resize(ctrl_NavgPts+1,-1.0);
   ctrl_cntl_pts.resize(ctrl_NavgPts+1,-1.0);

   // Compute some active control parameters
   Real area_tot = 1.0;
   const Real* problo = geom.ProbLo();
   const Real* probhi = geom.ProbHi();
   for (int dim = 0; dim < AMREX_SPACEDIM; dim++) {
      if (dim != ctrl_flameDir) area_tot *= (probhi[dim] - problo[dim]);
   }

   // Extract data from bc: assumes flow comes in from lo side of ctrl_flameDir
   ProbParm const* lprobparm = prob_parm_d;
   ACParm const* lacparm = ac_parm_d;
   pele::physics::PMF::PmfData::DataContainer const* lpmfdata = pmf_data.getDeviceData();
   amrex::Gpu::DeviceVector<amrex::Real> s_ext_v(DEF_NUM_STATE);
   amrex::Real* s_ext_d = s_ext_v.data();
   amrex::Real x[AMREX_SPACEDIM] = {AMREX_D_DECL(problo[0],problo[1],problo[2])};
   x[ctrl_flameDir] -= 1.0;
   const int ctrl_flameDir_l = ctrl_flameDir;
   const amrex::Real time_l = -1.0;
   const auto geomdata = geom.data();
   Box dumbx({AMREX_D_DECL(0,0,0)},{AMREX_D_DECL(0,0,0)});
   amrex::ParallelFor(dumbx, [x,s_ext_d,ctrl_flameDir_l,time_l,geomdata,lprobparm,lacparm, lpmfdata]
   AMREX_GPU_DEVICE(int /*i*/, int /*j*/, int /*k*/) noexcept
   {
      bcnormal(x, s_ext_d, ctrl_flameDir_l, 1, time_l, geomdata, *lprobparm, *lacparm, lpmfdata);
   });
   amrex::Real s_ext[DEF_NUM_STATE];
#ifdef AMREX_USE_GPU
   amrex::Gpu::dtoh_memcpy(s_ext,s_ext_d,sizeof(amrex::Real)*DEF_NUM_STATE);
#else
   std::memcpy(s_ext,s_ext_d,sizeof(amrex::Real)*DEF_NUM_STATE);
#endif

   if ( !ctrl_use_temp ) {
      // Get the fuel rhoY
      if (fuelName.empty()) {
          Abort("Using activeControl based on fuel mass requires ns.fuelName !");
      }
      Vector<std::string> specNames;
      pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(specNames);
      int fuelidx = -1;
      for (int k = 0; k < NUM_SPECIES; k++) {
         if ( !specNames[k].compare(fuelName) ) fuelidx = k;
      }
      ctrl_scale = area_tot * s_ext[first_spec+fuelidx];
      ctrl_cfix  = ctrl_h * ctrl_scale;
   } else {
      // If using temp, scale is 1.0
      ctrl_scale = 1.0;
      ctrl_cfix = ctrl_h;
   }

   // Extract initial ctrl_V_in from bc
   ctrl_V_in  = s_ext[ctrl_flameDir];
   ctrl_V_in_old = ctrl_V_in;

   // Pass V_in to bc
   ac_parm->ctrl_V_in = ctrl_V_in;
   amrex::Gpu::copy(amrex::Gpu::hostToDevice,ac_parm,ac_parm+1,ac_parm_d);

   if ( ctrl_verbose && ctrl_active ) {
      if ( ctrl_use_temp ) {
         Print() << " Active control based on temperature iso-level activated."
                 << " Maintaining the flame at " << ctrl_h << " in " << ctrl_flameDir << " direction. \n";
      } else {
         Print() << " Active control based on fuel mass activated."
                 << " Maintaining the flame at " << ctrl_h << " in " << ctrl_flameDir << " direction. \n";
      }
   }
}